

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# desugarer.cpp
# Opt level: O2

void __thiscall
jsonnet::internal::Desugarer::desugarFile
          (Desugarer *this,AST **ast,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsonnet::internal::VmExt,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsonnet::internal::VmExt>_>_>
          *tlas)

{
  AST *pAVar1;
  DesugaredObject *body_00;
  _Base_ptr p_Var2;
  Identifier *pIVar3;
  Var *pVVar4;
  Apply *a;
  LiteralString *b;
  Local *pLVar5;
  initializer_list<jsonnet::internal::FodderElement> __l;
  initializer_list<jsonnet::internal::FodderElement> __l_00;
  Identifier *body;
  bool local_16b;
  bool local_16a;
  allocator<char32_t> local_169;
  UString local_168;
  ArgParams args;
  Tokens tokens;
  LocationRange tla_loc;
  Apply *local_c0;
  Apply *local_b8;
  Fodder line_end;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  empty;
  Fodder line_end_blank;
  Var *local_68;
  Var *local_60;
  Conditional *local_58;
  string local_50;
  
  desugar(this,ast,0);
  ::std::__cxx11::string::string((string *)&local_50,(string *)&(*ast)->location);
  body_00 = stdlibAST(this,&local_50);
  ::std::__cxx11::string::~string((string *)&local_50);
  empty.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  empty.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  empty.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  FodderElement::FodderElement((FodderElement *)&tla_loc,LINE_END,1,0,&empty);
  __l._M_len = 1;
  __l._M_array = (iterator)&tla_loc;
  ::std::vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
  ::vector(&line_end_blank,__l,(allocator_type *)&local_168);
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&tla_loc.file.field_2);
  FodderElement::FodderElement((FodderElement *)&tla_loc,LINE_END,0,0,&empty);
  __l_00._M_len = 1;
  __l_00._M_array = (iterator)&tla_loc;
  ::std::vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
  ::vector(&line_end,__l_00,(allocator_type *)&local_168);
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&tla_loc.file.field_2);
  if (tlas != (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsonnet::internal::VmExt,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsonnet::internal::VmExt>_>_>
               *)0x0) {
    ::std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_168,"Top-level function",(allocator<char> *)&args);
    LocationRange::LocationRange(&tla_loc,(string *)&local_168);
    ::std::__cxx11::string::~string((string *)&local_168);
    args.
    super__Vector_base<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    args.
    super__Vector_base<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    args.
    super__Vector_base<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    for (p_Var2 = (tlas->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var2 != &(tlas->_M_t)._M_impl.super__Rb_tree_header;
        p_Var2 = (_Base_ptr)::std::_Rb_tree_increment(p_Var2)) {
      if ((char)p_Var2[3]._M_color == _S_black) {
        ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_168,"tla:",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (p_Var2 + 1));
        jsonnet_lex((Tokens *)
                    &tokens.
                     super__List_base<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_>
                    ,(string *)&local_168,*(char **)(p_Var2 + 2));
        ::std::__cxx11::string::~string((string *)&local_168);
        body = (Identifier *)
               jsonnet_parse(this->alloc,
                             (Tokens *)
                             &tokens.
                              super__List_base<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_>
                            );
        desugar(this,(AST **)&body,0);
        ::std::__cxx11::
        _List_base<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_>::_M_clear
                  (&tokens.
                    super__List_base<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_>
                  );
      }
      else {
        decode_utf8(&local_168,(string *)(p_Var2 + 2));
        body = (Identifier *)str(this,&local_168);
        ::std::__cxx11::u32string::~u32string((u32string *)&local_168);
      }
      decode_utf8(&local_168,(string *)(p_Var2 + 1));
      tokens.super__List_base<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_>.
      _M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)id(this,&local_168);
      ::std::vector<jsonnet::internal::ArgParam,std::allocator<jsonnet::internal::ArgParam>>::
      emplace_back<std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,jsonnet::internal::Identifier_const*,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,jsonnet::internal::AST*&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&>
                ((vector<jsonnet::internal::ArgParam,std::allocator<jsonnet::internal::ArgParam>> *)
                 &args,(vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                        *)EF,
                 (Identifier **)
                 &tokens.
                  super__List_base<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_>
                 ,(vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                   *)EF,(AST **)&body,
                 (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                  *)EF);
      ::std::__cxx11::u32string::~u32string((u32string *)&local_168);
    }
    ::std::__cxx11::u32string::u32string<std::allocator<char32_t>>
              ((u32string *)&local_168,L"top_level",(allocator<char32_t> *)&tokens);
    pIVar3 = id(this,&local_168);
    ::std::__cxx11::u32string::~u32string((u32string *)&local_168);
    pAVar1 = *ast;
    body = pIVar3;
    singleBind((Binds *)&tokens,this,pIVar3,pAVar1);
    pVVar4 = var(this,body);
    a = type(this,&pVVar4->super_AST);
    ::std::__cxx11::u32string::u32string<std::allocator<char32_t>>
              ((u32string *)&local_168,L"function",&local_169);
    b = str(this,&local_168);
    local_b8 = primitiveEquals(this,(LocationRange *)E,&a->super_AST,&b->super_AST);
    local_60 = make<jsonnet::internal::Var,jsonnet::internal::LocationRange_const&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>&,jsonnet::internal::Identifier_const*&>
                         (this,(LocationRange *)E,&line_end,&body);
    local_16a = false;
    local_16b = false;
    local_c0 = make<jsonnet::internal::Apply,jsonnet::internal::LocationRange&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,jsonnet::internal::Var*,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,std::vector<jsonnet::internal::ArgParam,std::allocator<jsonnet::internal::ArgParam>>&,bool,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,bool>
                         (this,&tla_loc,
                          (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                           *)EF,&local_60,
                          (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                           *)EF,&args,&local_16a,
                          (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                           *)EF,(vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                                 *)EF,&local_16b);
    local_68 = make<jsonnet::internal::Var,jsonnet::internal::LocationRange_const&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>&,jsonnet::internal::Identifier_const*&>
                         (this,(LocationRange *)E,&line_end,&body);
    local_58 = make<jsonnet::internal::Conditional,jsonnet::internal::LocationRange_const&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>&,jsonnet::internal::Apply*,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,jsonnet::internal::Apply*,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>&,jsonnet::internal::Var*>
                         (this,(LocationRange *)E,&line_end,&local_b8,
                          (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                           *)EF,&local_c0,&line_end,&local_68);
    pLVar5 = make<jsonnet::internal::Local,jsonnet::internal::LocationRange&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>&,std::vector<jsonnet::internal::Local::Bind,std::allocator<jsonnet::internal::Local::Bind>>,jsonnet::internal::Conditional*>
                       (this,&pAVar1->location,&line_end_blank,
                        (vector<jsonnet::internal::Local::Bind,_std::allocator<jsonnet::internal::Local::Bind>_>
                         *)&tokens,&local_58);
    *ast = &pLVar5->super_AST;
    ::std::__cxx11::u32string::~u32string((u32string *)&local_168);
    ::std::vector<jsonnet::internal::Local::Bind,_std::allocator<jsonnet::internal::Local::Bind>_>::
    ~vector((vector<jsonnet::internal::Local::Bind,_std::allocator<jsonnet::internal::Local::Bind>_>
             *)&tokens);
    ::std::vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>::
    ~vector(&args);
    ::std::__cxx11::string::~string((string *)&tla_loc);
  }
  pAVar1 = *ast;
  ::std::__cxx11::u32string::u32string<std::allocator<char32_t>>
            ((u32string *)&tla_loc,L"std",(allocator<char32_t> *)&args);
  pIVar3 = id(this,(UString *)&tla_loc);
  pVVar4 = std(this);
  singleBind((Binds *)&local_168,this,pIVar3,&pVVar4->super_AST);
  pLVar5 = make<jsonnet::internal::Local,jsonnet::internal::LocationRange&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,std::vector<jsonnet::internal::Local::Bind,std::allocator<jsonnet::internal::Local::Bind>>,jsonnet::internal::AST*&>
                     (this,&pAVar1->location,
                      (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                       *)EF,(vector<jsonnet::internal::Local::Bind,_std::allocator<jsonnet::internal::Local::Bind>_>
                             *)&local_168,ast);
  *ast = &pLVar5->super_AST;
  ::std::vector<jsonnet::internal::Local::Bind,_std::allocator<jsonnet::internal::Local::Bind>_>::
  ~vector((vector<jsonnet::internal::Local::Bind,_std::allocator<jsonnet::internal::Local::Bind>_> *
          )&local_168);
  ::std::__cxx11::u32string::~u32string((u32string *)&tla_loc);
  pAVar1 = *ast;
  ::std::__cxx11::u32string::u32string<std::allocator<char32_t>>
            ((u32string *)&tla_loc,L"$std",(allocator<char32_t> *)&args);
  pIVar3 = id(this,(UString *)&tla_loc);
  singleBind((Binds *)&local_168,this,pIVar3,&body_00->super_AST);
  pLVar5 = make<jsonnet::internal::Local,jsonnet::internal::LocationRange&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,std::vector<jsonnet::internal::Local::Bind,std::allocator<jsonnet::internal::Local::Bind>>,jsonnet::internal::AST*&>
                     (this,&pAVar1->location,
                      (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                       *)EF,(vector<jsonnet::internal::Local::Bind,_std::allocator<jsonnet::internal::Local::Bind>_>
                             *)&local_168,ast);
  *ast = &pLVar5->super_AST;
  ::std::vector<jsonnet::internal::Local::Bind,_std::allocator<jsonnet::internal::Local::Bind>_>::
  ~vector((vector<jsonnet::internal::Local::Bind,_std::allocator<jsonnet::internal::Local::Bind>_> *
          )&local_168);
  ::std::__cxx11::u32string::~u32string((u32string *)&tla_loc);
  ::std::vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
  ::~vector(&line_end);
  ::std::vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
  ::~vector(&line_end_blank);
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&empty);
  return;
}

Assistant:

void desugarFile(AST *&ast, std::map<std::string, VmExt> *tlas)
    {
        desugar(ast, 0);

        DesugaredObject *std_obj = stdlibAST(ast->location.file);

        std::vector<std::string> empty;
        auto line_end_blank = Fodder{{FodderElement::LINE_END, 1, 0, empty}};
        auto line_end = Fodder{{FodderElement::LINE_END, 0, 0, empty}};

        // local body = ast;
        // if std.type(body) == "function") then
        //     body(tlas...)
        // else
        //     body
        if (tlas != nullptr) {
            LocationRange tla_loc("Top-level function");
            ArgParams args;
            for (const auto &pair : *tlas) {
                AST *expr;
                if (pair.second.isCode) {
                    Tokens tokens = jsonnet_lex("tla:" + pair.first, pair.second.data.c_str());
                    expr = jsonnet_parse(alloc, tokens);
                    desugar(expr, 0);
                } else {
                    expr = str(decode_utf8(pair.second.data));
                }
                // Add them as named arguments, so order does not matter.
                args.emplace_back(EF, id(decode_utf8(pair.first)), EF, expr, EF);
            }
            const Identifier *body = id(U"top_level");
            ast =
                make<Local>(ast->location,
                            line_end_blank,
                            singleBind(body, ast),
                            make<Conditional>(E,
                                              line_end,
                                              primitiveEquals(E, type(var(body)), str(U"function")),
                                              EF,
                                              make<Apply>(tla_loc,
                                                          EF,
                                                          make<Var>(E, line_end, body),
                                                          EF,
                                                          args,
                                                          false,  // trailing comma
                                                          EF,
                                                          EF,
                                                          false  // tailstrict
                                                          ),
                                              line_end,
                                              make<Var>(E, line_end, body)));
        }

        // local $std = (std.jsonnet stuff); std = $std; ast
        // The standard library is bound to $std, which cannot be overriden,
        // so redefining std won't break expressions that desugar to calls
        // to standard library functions.
        ast = make<Local>(ast->location, EF, singleBind(id(U"std"), std()), ast);
        ast = make<Local>(ast->location, EF, singleBind(id(U"$std"), std_obj), ast);
    }